

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void __thiscall
glslang::TObjectReflection::TObjectReflection
          (TObjectReflection *this,string *pName,TType *pType,int pOffset,int pGLDefineType,
          int pSize,int pIndex)

{
  int iVar1;
  undefined4 extraout_var;
  void *__child_stack;
  __fn *__fn;
  int iVar2;
  undefined4 in_register_00000084;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  __fn = (__fn *)(pName->_M_dataplus)._M_p;
  iVar1 = pOffset;
  iVar2 = pGLDefineType;
  std::__cxx11::string::_M_construct<char*>((string *)this,__fn,__fn + pName->_M_string_length);
  this->offset = pOffset;
  this->glDefineType = pGLDefineType;
  this->size = pSize;
  this->index = pIndex;
  this->counterIndex = -1;
  this->numMembers = -1;
  this->arrayStride = 0;
  this->topLevelArrayStride = 0;
  this->stages = 0;
  iVar1 = TType::clone(pType,__fn,__child_stack,iVar1,(void *)CONCAT44(in_register_00000084,iVar2));
  this->type = (TType *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

TObjectReflection::TObjectReflection(const std::string &pName, const TType &pType, int pOffset, int pGLDefineType,
                                     int pSize, int pIndex)
    : name(pName), offset(pOffset), glDefineType(pGLDefineType), size(pSize), index(pIndex), counterIndex(-1),
      numMembers(-1), arrayStride(0), topLevelArrayStride(0), stages(EShLanguageMask(0)), type(pType.clone())
{
}